

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O0

Privkey * __thiscall
cfd::core::TapBranch::GetTweakedPrivkey
          (Privkey *__return_storage_ptr__,TapBranch *this,Privkey *internal_privkey,bool *parity)

{
  Privkey *in_stack_ffffffffffffff18;
  Privkey *this_00;
  SchnorrPubkey local_c8;
  undefined1 local_b0 [8];
  ByteData256 hash;
  undefined1 local_68 [8];
  Privkey privkey;
  SchnorrPubkey internal_pubkey;
  bool is_parity;
  bool *parity_local;
  Privkey *internal_privkey_local;
  TapBranch *this_local;
  
  internal_pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  this_00 = __return_storage_ptr__;
  SchnorrPubkey::FromPrivkey
            ((SchnorrPubkey *)&privkey.is_compressed_,internal_privkey,
             (bool *)((long)&internal_pubkey.data_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  Privkey::Privkey(this_00,in_stack_ffffffffffffff18);
  if ((internal_pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
    Privkey::CreateNegate
              ((Privkey *)
               &hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage,internal_privkey);
    Privkey::operator=(this_00,in_stack_ffffffffffffff18);
    Privkey::~Privkey((Privkey *)0x4939df);
  }
  GetTapTweak((ByteData256 *)local_b0,this,(SchnorrPubkey *)&privkey.is_compressed_);
  SchnorrPubkey::CreateTweakAdd
            (&local_c8,(SchnorrPubkey *)&privkey.is_compressed_,(ByteData256 *)local_b0,
             (bool *)((long)&internal_pubkey.data_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)0x493a45);
  if (parity != (bool *)0x0) {
    *parity = (bool)(internal_pubkey.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._7_1_ & 1);
  }
  Privkey::CreateTweakAdd(this_00,(Privkey *)local_68,(ByteData256 *)local_b0);
  ByteData256::~ByteData256((ByteData256 *)0x493a99);
  Privkey::~Privkey((Privkey *)0x493aa2);
  SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)0x493aab);
  return __return_storage_ptr__;
}

Assistant:

Privkey TapBranch::GetTweakedPrivkey(
    const Privkey& internal_privkey, bool* parity) const {
  bool is_parity = false;
  auto internal_pubkey =
      SchnorrPubkey::FromPrivkey(internal_privkey, &is_parity);
  Privkey privkey = internal_privkey;
  if (is_parity) privkey = internal_privkey.CreateNegate();

  ByteData256 hash = GetTapTweak(internal_pubkey);
  internal_pubkey.CreateTweakAdd(hash, &is_parity);
  if (parity != nullptr) *parity = is_parity;
  return privkey.CreateTweakAdd(hash);
}